

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O3

void shuff_interp_decode(bit_io_t *bio,uint64_t *A,uint64_t n)

{
  undefined8 *puVar1;
  int64_t *piVar2;
  stack *psVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  ulong uVar7;
  undefined8 *__s;
  size_t __size;
  stack *psVar8;
  long in_R8;
  long lVar9;
  uint64_t uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 in_ZMM1 [64];
  
  *A = 0;
  A[n] = 0x8000000;
  lVar5 = LZCOUNT(n - 1);
  uVar14 = 0x40 - lVar5;
  if (n - 1 == 0) {
    uVar14 = 0;
  }
  if (shuff_interp_decode::ss <= uVar14) {
    __size = uVar14 * 0x10 + 0x10;
    psVar3 = (stack *)realloc(shuff_interp_decode::s,__size);
    if (psVar3 == (stack *)0x0) {
      psVar8 = shuff_interp_decode::s;
      shuff_interp_decode::s = psVar3;
      shuff_interp_decode();
      if (-1 < in_R8) {
        puVar1 = (undefined8 *)((long)__s + in_R8 * 8 + 1);
        puVar6 = __s + 1;
        if (__s + 1 < puVar1) {
          puVar6 = puVar1;
        }
        memset(__s,0,(~(ulong)__s + (long)puVar6 & 0xfffffffffffffff8) + 8);
      }
      if ((long)__size < 1) {
        lVar4 = 0;
      }
      else {
        piVar2 = &psVar8->lo;
        lVar4 = 0;
        do {
          uVar14 = (ulong)((int)psVar8->lo + 1);
          lVar12 = __s[uVar14];
          if (lVar12 == 0) {
            *(ulong *)(lVar5 + lVar4 * 8) = uVar14;
            lVar4 = lVar4 + 1;
            lVar12 = __s[uVar14];
          }
          psVar8 = (stack *)((long)&psVar8->lo + 4);
          __s[uVar14] = lVar12 + 1;
        } while (psVar8 < (stack *)((long)piVar2 + __size * 4));
      }
      *__s = 1;
      *(undefined8 *)(lVar5 + lVar4 * 8) = 0;
      return;
    }
    shuff_interp_decode::ss = uVar14 + 1;
    shuff_interp_decode::s = psVar3;
  }
  psVar3 = shuff_interp_decode::s;
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar19 = vpbroadcastq_avx512f(ZEXT816(8));
  lVar5 = 1;
  auVar20 = vpternlogd_avx512f(in_ZMM1,in_ZMM1,in_ZMM1,0xff);
  shuff_interp_decode::s->lo = 0;
  psVar3->hi = n;
  do {
    uVar10 = 1;
    uVar14 = psVar3[lVar5 + -1].lo;
    lVar4 = psVar3[lVar5 + -1].hi;
    lVar12 = A[lVar4] - (A[uVar14] + (lVar4 - uVar14));
    lVar13 = lVar12 + 1;
    if (lVar13 != 1) {
      uVar17 = LZCOUNT(lVar12);
      if (uVar17 == 0x3f) {
        uVar11 = 0;
      }
      else {
        uVar7 = bio->buff_btg;
        uVar15 = uVar17 ^ 0x3f;
        uVar11 = (*bio->in_u64 << ((ulong)(byte)-(char)uVar7 & 0x3f)) >>
                 ((ulong)((int)uVar17 + 1) & 0x3f);
        uVar10 = uVar7 - uVar15;
        if (uVar7 < uVar15 || uVar10 == 0) {
          puVar16 = bio->in_u64 + 1;
          lVar12 = uVar15 - uVar7;
          bio->in_u64 = puVar16;
          bio->buff_btg = 0x40;
          if (lVar12 == 0 || (long)uVar15 < (long)uVar7) goto LAB_001229e2;
          uVar10 = 0x40 - lVar12;
          uVar11 = uVar11 | *puVar16 >> (-lVar12 & 0x3fU);
        }
        bio->buff_btg = uVar10;
      }
LAB_001229e2:
      lVar13 = (1 << ((byte)-(char)uVar17 & 0x1f)) - lVar13;
      if (lVar13 <= (long)uVar11) {
        uVar7 = bio->buff_btg - 1;
        bio->buff_btg = uVar7;
        uVar17 = *bio->in_u64;
        if (uVar7 == 0) {
          bio->in_u64 = bio->in_u64 + 1;
          bio->buff_btg = 0x40;
        }
        uVar11 = (uVar11 * 2 - lVar13) + (ulong)((uVar17 >> (uVar7 & 0x3f) & 1) != 0);
      }
      uVar10 = uVar11 + 1;
    }
    lVar9 = (long)(lVar4 - uVar14) >> 1;
    lVar12 = lVar5 + -1;
    lVar13 = lVar9 + uVar14;
    A[lVar13] = uVar10;
    uVar10 = (uVar10 - 1) + A[uVar14] + lVar9;
    A[lVar13] = uVar10;
    if (A[lVar4] - uVar10 == lVar4 - lVar13) {
      if (lVar13 + 1 < lVar4) {
        auVar21 = vpbroadcastq_avx512f();
        auVar21 = vpaddq_avx512f(auVar21,auVar18);
        auVar22 = vpbroadcastq_avx512f();
        uVar17 = 0;
        do {
          auVar23 = vpbroadcastq_avx512f();
          auVar24 = vpsubq_avx512f(auVar21,auVar20);
          auVar21 = vpaddq_avx512f(auVar21,auVar19);
          auVar23 = vporq_avx512f(auVar23,auVar18);
          vpcmpuq_avx512f(auVar23,auVar22,2);
          auVar23 = vmovdqu64_avx512f(auVar24);
          *(undefined1 (*) [64])(A + lVar13 + 1 + uVar17) = auVar23;
          uVar17 = uVar17 + 8;
        } while ((((lVar4 + ~uVar14) - lVar9) + 7 & 0xfffffffffffffff8) != uVar17);
      }
    }
    else if (1 < lVar4 - lVar13) {
      psVar3[lVar12].lo = lVar13;
      psVar3[lVar12].hi = lVar4;
      lVar12 = lVar5;
    }
    lVar5 = lVar12;
    if (A[lVar13] - A[uVar14] == lVar9) {
      if (1 < lVar9) {
        auVar21 = vpbroadcastq_avx512f();
        auVar21 = vpaddq_avx512f(auVar21,auVar18);
        lVar4 = uVar14 + 2;
        if ((long)(uVar14 + 2) < lVar13) {
          lVar4 = lVar13;
        }
        uVar17 = 0;
        auVar22 = vpbroadcastq_avx512f();
        do {
          auVar23 = vpbroadcastq_avx512f();
          auVar24 = vpsubq_avx512f(auVar21,auVar20);
          auVar21 = vpaddq_avx512f(auVar21,auVar19);
          auVar23 = vporq_avx512f(auVar23,auVar18);
          vpcmpuq_avx512f(auVar23,auVar22,2);
          auVar23 = vmovdqu64_avx512f(auVar24);
          *(undefined1 (*) [64])(A + uVar14 + uVar17 + 1) = auVar23;
          uVar17 = uVar17 + 8;
        } while ((lVar4 + 7 + ~uVar14 & 0xfffffffffffffff8) != uVar17);
      }
    }
    else if (1 < lVar9) {
      psVar3[lVar5].lo = uVar14;
      psVar3[lVar5].hi = lVar13;
      lVar5 = lVar5 + 1;
    }
    if (lVar5 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void shuff_interp_decode(bit_io_t* bio, uint64_t A[], uint64_t n)
{
    int64_t lo, hi, mid, range, j;
    static stack* s = NULL;
    static uint64_t ss = 0;
    uint64_t stack_pointer = 0;

    A[0] = 0;
    A[n] = SHUFF_MAX_SYMBOL;

    SHUFF_CHECK_STACK_SIZE(SHUFF_ceil_log2(n) + 1);

    SHUFF_PUSH(0, n);
    while (SHUFF_STACK_NOT_EMPTY) {
        SHUFF_POP(lo, hi);
        range = A[hi] - A[lo] - (hi - lo - 1);
        mid = lo + ((hi - lo) >> 1);
        SHUFF_BINARY_DECODE(bio, A[mid], range);
        A[mid] += A[lo] + (mid - lo - 1);

        if (A[hi] - A[mid] == (uint64_t)(hi - mid)) // fill in the gaps of 1
            for (j = mid + 1; j < hi; j++)
                A[j] = A[j - 1] + 1;
        else if (hi - mid > 1)
            SHUFF_PUSH(mid, hi);

        if (A[mid] - A[lo] == (uint64_t)(mid - lo)) // fill in the gaps of 1
            for (j = lo + 1; j < mid; j++)
                A[j] = A[j - 1] + 1;
        else if (mid - lo > 1)
            SHUFF_PUSH(lo, mid);
    }
}